

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base.h
# Opt level: O3

void __thiscall
fructose::test_base<TestAdsPerformance>::add_test
          (test_base<TestAdsPerformance> *this,string *name,test_case the_test)

{
  pointer pcVar1;
  iterator iVar2;
  ostream *poVar3;
  mapped_type *this_00;
  stringstream str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188 [3];
  ios_base local_138 [264];
  
  if ((this->m_exceptionPending)._M_string_length == 0) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
            ::find(&(this->m_tests)._M_t,name);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->m_tests)._M_t._M_impl.super__Rb_tree_header) {
      pcVar1 = (name->_M_dataplus)._M_p;
      local_1f0 = &local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,pcVar1,pcVar1 + name->_M_string_length);
      if (local_1f0 == &local_1e0) {
        local_198._8_8_ = local_1e0._8_8_;
        local_1a8._M_allocated_capacity = (size_type)&local_198;
      }
      else {
        local_1a8._M_allocated_capacity = (size_type)local_1f0;
      }
      local_1a8._8_8_ = local_1e8;
      local_1f0 = &local_1e0;
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      local_188[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8._0_8_ = the_test;
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
                ::operator[](&this->m_tests,name);
      std::
      pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>
      ::operator=(this_00,(type)local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity != &local_198) {
        operator_delete((void *)local_1a8._M_allocated_capacity);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0);
      }
      pcVar1 = (name->_M_dataplus)._M_p;
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,pcVar1,pcVar1 + name->_M_string_length);
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = 0;
      local_188[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>::
      emplace_back<fructose::test_root::test_info>(&this->m_available_tests,(test_info *)local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_198);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"add_test called with test name \'",0x20);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1b8 + 0x10),(name->_M_dataplus)._M_p,
                          name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\' which has already been added.",0x1f);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->m_exceptionPending,(string *)&local_1f0);
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
  }
  return;
}

Assistant:

inline void 
test_base<test_container>::add_test(const std::string& name, 
                                    test_case the_test)
{
    if (m_exceptionPending.length() > 0)
    {
        return;
    }

    typename std::map<std::string, std::pair<test_case, test_info> >::const_iterator it = m_tests.find(name);
    if (it == m_tests.end())
    {
        m_tests[name] = std::make_pair(the_test, test_info(name));
        m_available_tests.push_back(name);
    }
    else
    {
        std::stringstream str;
        str << "add_test called with test name '" << name
            << "' which has already been added.";
        m_exceptionPending = str.str();
    }
}